

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-mltpctive-dynamical-system.cpp
# Opt level: O2

void __thiscall
stateObservation::IMUMltpctiveDynamicalSystem::stateDifference
          (IMUMltpctiveDynamicalSystem *this,Vector *stateVector1,Vector *stateVector2,
          Vector *difference)

{
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> local_1a8;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> local_178;
  VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> local_148;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_118;
  Vector3 local_b0;
  Matrix<double,_4,_1,_0,_4,_1> local_98;
  Quaternion<double,_0> res;
  QuaternionBase<Eigen::Quaternion<double,_0>_> local_58 [40];
  
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,0x12);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_148,stateVector1,0,3);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_178,stateVector2
             ,0,3);
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_
  ;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       m_data;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       _8_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_1a8,difference,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const>>
            (&local_1a8.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&local_118)
  ;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_148,stateVector1,7,3);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_178,stateVector2
             ,7,3);
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_
  ;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       m_data;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       _8_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_1a8,difference,6,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const>>
            (&local_1a8.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&local_118)
  ;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_148,stateVector1,0xd,3);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_178,stateVector2
             ,0xd,3);
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_
  ;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       m_data;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       _8_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_1a8,difference,0xc,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const>>
            (&local_1a8.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&local_118)
  ;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4> *)&local_118,stateVector1
             ,3,4);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,4,1,false>>
            ((Matrix<double,_4,_1,_0,_4,_1> *)local_58,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false> *)&local_118);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4> *)&local_148,stateVector2
             ,3,4);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,4,1,false>>
            (&local_98,
             (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false> *)&local_148);
  res.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [0]._4_4_ = local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
              .array[0]._4_4_ ^ 0x80000000;
  res.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [1]._4_4_ = local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
              .array[1]._4_4_ ^ 0x80000000;
  res.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [0]._0_4_ = local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
              .array[0]._0_4_;
  res.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [1]._0_4_ = local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
              .array[1]._0_4_;
  res.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [2]._4_4_ = local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
              .array[2]._4_4_ ^ 0x80000000;
  res.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [2]._0_4_ = local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
              .array[2]._0_4_;
  res.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [3]._0_4_ = local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
              .array[3]._0_4_;
  res.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
  [3]._4_4_ = local_98.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
              .array[3]._4_4_;
  Eigen::internal::
  quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
            (local_58,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)&res);
  kine::quaternionToRotationVector(&local_b0,(Quaternion *)&local_1a8);
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_178,difference,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&local_b0);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_148,stateVector1,10,3);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_178,stateVector2
             ,10,3);
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_
  ;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       m_data;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       _8_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_1a8,difference,9,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const>>
            (&local_1a8.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&local_118)
  ;
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_148,stateVector1,0x10,3);
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3> *)&local_178,stateVector2
             ,0x10,3);
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_
  ;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>
            .super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       m_data;
  local_118.m_lhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_148.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.
       _8_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>.m_data;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_ =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>._8_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_xpr;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.m_startRow.
  m_value = local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
            super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
            m_startRow.m_value;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_ =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>._32_8_;
  local_118.m_rhs.
  super_BlockImpl<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
  m_outerStride =
       local_178.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>.
       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_Eigen::Dense>.
       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false,_true>.
       m_outerStride;
  Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3>::VectorBlock
            (&local_1a8,difference,0xf,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>const>>
            (&local_1a8.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,&local_118)
  ;
  return;
}

Assistant:

void IMUMltpctiveDynamicalSystem::stateDifference(const Vector & stateVector1,
                                                  const Vector & stateVector2,
                                                  Vector & difference)
{
  difference.resize(indexesTangent::size);
  difference.segment<3>(indexesTangent::pos) =
      stateVector1.segment<3>(indexes::pos) - stateVector2.segment<3>(indexes::pos);
  difference.segment<3>(indexesTangent::linVel) =
      stateVector1.segment<3>(indexes::linVel) - stateVector2.segment<3>(indexes::linVel);
  difference.segment<3>(indexesTangent::linAcc) =
      stateVector1.segment<3>(indexes::linAcc) - stateVector2.segment<3>(indexes::linAcc);

  difference.segment<3>(indexesTangent::ori) =
      kine::quaternionToRotationVector(Quaternion(stateVector1.segment<4>(indexes::ori))
                                       * Quaternion(stateVector2.segment<4>(indexes::ori)).conjugate());
  difference.segment<3>(indexesTangent::angVel) =
      stateVector1.segment<3>(indexes::angVel) - stateVector2.segment<3>(indexes::angVel);
  difference.segment<3>(indexesTangent::angAcc) =
      stateVector1.segment<3>(indexes::angAcc) - stateVector2.segment<3>(indexes::angAcc);
}